

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool Datetime::valid(int y,int m,int d,int hr,int mi,int se)

{
  int se_local;
  int mi_local;
  int hr_local;
  int d_local;
  int m_local;
  int y_local;
  
  if ((hr < 0) || (0x18 < hr)) {
    m_local._3_1_ = false;
  }
  else if ((mi < 0) || (0x3b < mi)) {
    m_local._3_1_ = false;
  }
  else if ((se < 0) || (0x3b < se)) {
    m_local._3_1_ = false;
  }
  else if ((hr == 0x18) && ((mi != 0 || (se != 0)))) {
    m_local._3_1_ = false;
  }
  else {
    m_local._3_1_ = valid(y,m,d);
  }
  return m_local._3_1_;
}

Assistant:

bool Datetime::valid (
  const int y, const int m, const int d,
  const int hr, const int mi, const int se)
{
  if (hr < 0 || hr > 24)
    return false;

  if (mi < 0 || mi > 59)
    return false;

  if (se < 0 || se > 59)
    return false;

  if (hr == 24 &&
      (mi != 0 ||
       se != 0))
    return false;

  return Datetime::valid (y, m, d);
}